

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

bool jbcoin::STObject::equivalentSTObjectSameTemplate(STObject *obj1,STObject *obj2)

{
  pointer pSVar1;
  pointer pSVar2;
  STBase *pSVar3;
  STBase *pSVar4;
  int iVar5;
  int iVar6;
  pointer pSVar7;
  STBase **ppSVar8;
  bool bVar9;
  
  if (obj1->mType == (SOTemplate *)0x0) {
    __assert_fail("obj1.mType != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STObject.cpp"
                  ,0x2fc,
                  "static bool jbcoin::STObject::equivalentSTObjectSameTemplate(const STObject &, const STObject &)"
                 );
  }
  if (obj1->mType != obj2->mType) {
    __assert_fail("obj1.mType == obj2.mType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STObject.cpp"
                  ,0x2fd,
                  "static bool jbcoin::STObject::equivalentSTObjectSameTemplate(const STObject &, const STObject &)"
                 );
  }
  pSVar7 = (obj1->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar1 = (obj1->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pSVar2 = (obj2->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((long)pSVar7 - (long)pSVar1 ==
      (long)pSVar2 -
      (long)(obj2->v_).
            super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
    ppSVar8 = &pSVar2->p_;
    for (; bVar9 = pSVar7 == pSVar1, !bVar9; pSVar7 = pSVar7 + 1) {
      pSVar3 = pSVar7->p_;
      pSVar4 = *ppSVar8;
      iVar5 = (*pSVar3->_vptr_STBase[4])(pSVar3);
      iVar6 = (*pSVar4->_vptr_STBase[4])(pSVar4);
      if (iVar5 != iVar6) {
        return bVar9;
      }
      iVar5 = (*pSVar3->_vptr_STBase[9])(pSVar3,pSVar4);
      if ((char)iVar5 == '\0') {
        return bVar9;
      }
      ppSVar8 = ppSVar8 + 0xc;
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool STObject::equivalentSTObjectSameTemplate (
    STObject const& obj1, STObject const& obj2)
{
    assert (obj1.mType != nullptr);
    assert (obj1.mType == obj2.mType);

    return std::equal (obj1.begin (), obj1.end (), obj2.begin (), obj2.end (),
        [] (STBase const& st1, STBase const& st2)
        {
            return (st1.getSType() == st2.getSType()) &&
                st1.isEquivalent (st2);
        });
}